

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isDriveStrength(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if (((((ushort)(kind - HighZ0Keyword) < 2) || ((ushort)(kind - Pull0Keyword) < 2)) ||
      ((ushort)(kind - Strong0Keyword) < 2)) ||
     (((ushort)(kind - Supply0Keyword) < 2 || (kind == Weak0Keyword || kind == Weak1Keyword)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isDriveStrength(TokenKind kind) {
    switch (kind) {
        case TokenKind::Supply0Keyword:
        case TokenKind::Strong0Keyword:
        case TokenKind::Pull0Keyword:
        case TokenKind::Weak0Keyword:
        case TokenKind::HighZ0Keyword:
        case TokenKind::Supply1Keyword:
        case TokenKind::Strong1Keyword:
        case TokenKind::Pull1Keyword:
        case TokenKind::Weak1Keyword:
        case TokenKind::HighZ1Keyword:
            return true;
        default:
            return false;
    }
}